

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O1

void HotKey_ToggleFullScreen(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  piVar2 = (int *)SDL_GetVideoSurface();
  iVar1 = SDL_WM_ToggleFullScreen(piVar2);
  if (iVar1 != 0) {
    pcVar3 = "fullscreen";
    if (-1 < *piVar2) {
      pcVar3 = "windowed";
    }
    printf("Toggled fullscreen mode - now %s\n",pcVar3);
    return;
  }
  puts("Unable to toggle fullscreen mode");
  return;
}

Assistant:

void HotKey_ToggleFullScreen(void)
{
	SDL_Surface *screen;

	screen = SDL_GetVideoSurface();
	if ( SDL_WM_ToggleFullScreen(screen) ) {
		printf("Toggled fullscreen mode - now %s\n",
		    (screen->flags&SDL_FULLSCREEN) ? "fullscreen" : "windowed");
	} else {
		printf("Unable to toggle fullscreen mode\n");
	}
}